

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexturefiledata.cpp
# Opt level: O0

void __thiscall QTextureFileData::setData(QTextureFileData *this,QImage *image,int level,int face)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  QImage *in_RSI;
  QVLABase<QList<QImage>_> *in_RDI;
  bool in_stack_0000004f;
  QTextureFileDataPrivate *in_stack_00000050;
  int in_stack_00000068;
  int in_stack_0000006c;
  QSharedDataPointer<QTextureFileDataPrivate> *in_stack_ffffffffffffffe0;
  QImage *this_00;
  
  QSharedDataPointer<QTextureFileDataPrivate>::operator->(in_stack_ffffffffffffffe0);
  QTextureFileDataPrivate::ensureSize
            (in_stack_00000050,in_stack_0000006c,in_stack_00000068,in_stack_0000004f);
  this_00 = in_RSI;
  QSharedDataPointer<QTextureFileDataPrivate>::operator->
            ((QSharedDataPointer<QTextureFileDataPrivate> *)in_RSI);
  QVLABase<QList<QImage>_>::operator[](in_RDI,0x8c2837);
  QList<QImage>::operator[]((QList<QImage> *)in_RSI,(qsizetype)in_RDI);
  QImage::operator=(this_00,(QImage *)CONCAT44(in_EDX,in_ECX));
  return;
}

Assistant:

void QTextureFileData::setData(const QImage &image, int level, int face)
{
    Q_ASSERT(d->mode == ImageMode);
    d->ensureSize(level + 1, face + 1);
    d->images[face][level] = image;
}